

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcol.c
# Opt level: O0

int ffgsv(fitsfile *fptr,int datatype,long *blc,long *trc,long *inc,void *nulval,void *array,
         int *anynul,int *status)

{
  int iVar1;
  long local_b0;
  LONGLONG nelem;
  long naxes [9];
  int local_58;
  int local_54;
  int ii;
  int naxis;
  void *nulval_local;
  long *inc_local;
  long *trc_local;
  long *blc_local;
  fitsfile *pfStack_28;
  int datatype_local;
  fitsfile *fptr_local;
  
  local_b0 = 1;
  if (*status < 1) {
    _ii = (double *)nulval;
    nulval_local = inc;
    inc_local = trc;
    trc_local = blc;
    blc_local._4_4_ = datatype;
    pfStack_28 = fptr;
    ffgidm(fptr,&local_54,status);
    ffgisz(pfStack_28,9,&nelem,status);
    iVar1 = fits_is_compressed_image(pfStack_28,status);
    if (iVar1 == 0) {
      for (local_58 = 0;
          (((local_58 < local_54 && (*(long *)((long)nulval_local + (long)local_58 * 8) == 1)) &&
           (trc_local[local_58] == 1)) && (inc_local[local_58] == naxes[(long)local_58 + -1]));
          local_58 = local_58 + 1) {
        local_b0 = local_b0 * naxes[(long)local_58 + -1];
      }
      if (local_58 == local_54) {
        ffgpxv(pfStack_28,blc_local._4_4_,trc_local,local_b0,_ii,array,anynul,status);
        return *status;
      }
    }
    if (blc_local._4_4_ == 0xb) {
      if (_ii == (double *)0x0) {
        ffgsvb(pfStack_28,1,local_54,&nelem,trc_local,inc_local,(long *)nulval_local,'\0',
               (uchar *)array,anynul,status);
      }
      else {
        ffgsvb(pfStack_28,1,local_54,&nelem,trc_local,inc_local,(long *)nulval_local,*(uchar *)_ii,
               (uchar *)array,anynul,status);
      }
    }
    else if (blc_local._4_4_ == 0xc) {
      if (_ii == (double *)0x0) {
        ffgsvsb(pfStack_28,1,local_54,&nelem,trc_local,inc_local,(long *)nulval_local,'\0',
                (char *)array,anynul,status);
      }
      else {
        ffgsvsb(pfStack_28,1,local_54,&nelem,trc_local,inc_local,(long *)nulval_local,*(char *)_ii,
                (char *)array,anynul,status);
      }
    }
    else if (blc_local._4_4_ == 0x14) {
      if (_ii == (double *)0x0) {
        ffgsvui(pfStack_28,1,local_54,&nelem,trc_local,inc_local,(long *)nulval_local,0,
                (unsigned_short *)array,anynul,status);
      }
      else {
        ffgsvui(pfStack_28,1,local_54,&nelem,trc_local,inc_local,(long *)nulval_local,
                *(unsigned_short *)_ii,(unsigned_short *)array,anynul,status);
      }
    }
    else if (blc_local._4_4_ == 0x15) {
      if (_ii == (double *)0x0) {
        ffgsvi(pfStack_28,1,local_54,&nelem,trc_local,inc_local,(long *)nulval_local,0,
               (short *)array,anynul,status);
      }
      else {
        ffgsvi(pfStack_28,1,local_54,&nelem,trc_local,inc_local,(long *)nulval_local,*(short *)_ii,
               (short *)array,anynul,status);
      }
    }
    else if (blc_local._4_4_ == 0x1e) {
      if (_ii == (double *)0x0) {
        ffgsvuk(pfStack_28,1,local_54,&nelem,trc_local,inc_local,(long *)nulval_local,0,
                (uint *)array,anynul,status);
      }
      else {
        ffgsvuk(pfStack_28,1,local_54,&nelem,trc_local,inc_local,(long *)nulval_local,
                (uint)*(float *)_ii,(uint *)array,anynul,status);
      }
    }
    else if (blc_local._4_4_ == 0x1f) {
      if (_ii == (double *)0x0) {
        ffgsvk(pfStack_28,1,local_54,&nelem,trc_local,inc_local,(long *)nulval_local,0,(int *)array,
               anynul,status);
      }
      else {
        ffgsvk(pfStack_28,1,local_54,&nelem,trc_local,inc_local,(long *)nulval_local,
               (int)*(float *)_ii,(int *)array,anynul,status);
      }
    }
    else if (blc_local._4_4_ == 0x28) {
      if (_ii == (double *)0x0) {
        ffgsvuj(pfStack_28,1,local_54,&nelem,trc_local,inc_local,(long *)nulval_local,0,
                (unsigned_long *)array,anynul,status);
      }
      else {
        ffgsvuj(pfStack_28,1,local_54,&nelem,trc_local,inc_local,(long *)nulval_local,
                (unsigned_long)*_ii,(unsigned_long *)array,anynul,status);
      }
    }
    else if (blc_local._4_4_ == 0x29) {
      if (_ii == (double *)0x0) {
        ffgsvj(pfStack_28,1,local_54,&nelem,trc_local,inc_local,(long *)nulval_local,0,(long *)array
               ,anynul,status);
      }
      else {
        ffgsvj(pfStack_28,1,local_54,&nelem,trc_local,inc_local,(long *)nulval_local,(long)*_ii,
               (long *)array,anynul,status);
      }
    }
    else if (blc_local._4_4_ == 0x50) {
      if (_ii == (double *)0x0) {
        ffgsvujj(pfStack_28,1,local_54,&nelem,trc_local,inc_local,(long *)nulval_local,0,
                 (ULONGLONG *)array,anynul,status);
      }
      else {
        ffgsvujj(pfStack_28,1,local_54,&nelem,trc_local,inc_local,(long *)nulval_local,
                 (ULONGLONG)*_ii,(ULONGLONG *)array,anynul,status);
      }
    }
    else if (blc_local._4_4_ == 0x51) {
      if (_ii == (double *)0x0) {
        ffgsvjj(pfStack_28,1,local_54,&nelem,trc_local,inc_local,(long *)nulval_local,0,
                (LONGLONG *)array,anynul,status);
      }
      else {
        ffgsvjj(pfStack_28,1,local_54,&nelem,trc_local,inc_local,(long *)nulval_local,(LONGLONG)*_ii
                ,(LONGLONG *)array,anynul,status);
      }
    }
    else if (blc_local._4_4_ == 0x2a) {
      if (_ii == (double *)0x0) {
        ffgsve(pfStack_28,1,local_54,&nelem,trc_local,inc_local,(long *)nulval_local,0.0,
               (float *)array,anynul,status);
      }
      else {
        ffgsve(pfStack_28,1,local_54,&nelem,trc_local,inc_local,(long *)nulval_local,*(float *)_ii,
               (float *)array,anynul,status);
      }
    }
    else if (blc_local._4_4_ == 0x52) {
      if (_ii == (double *)0x0) {
        ffgsvd(pfStack_28,1,local_54,&nelem,trc_local,inc_local,(long *)nulval_local,0.0,
               (double *)array,anynul,status);
      }
      else {
        ffgsvd(pfStack_28,1,local_54,&nelem,trc_local,inc_local,(long *)nulval_local,*_ii,
               (double *)array,anynul,status);
      }
    }
    else {
      *status = 0x19a;
    }
    fptr_local._4_4_ = *status;
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffgsv(  fitsfile *fptr,   /* I - FITS file pointer                       */
            int  datatype,    /* I - datatype of the value                   */
            long *blc,        /* I - 'bottom left corner' of the subsection  */
            long *trc ,       /* I - 'top right corner' of the subsection    */
            long *inc,        /* I - increment to be applied in each dim.    */
            void *nulval,     /* I - value for undefined pixels              */
            void *array,      /* O - array of values that are returned       */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
  Read an section of values from the primary array. The datatype of the
  input array is defined by the 2nd argument.  Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being read).
  Undefined elements will be set equal to NULVAL, unless NULVAL=0
  in which case no checking for undefined values will be performed.
  ANYNUL is returned with a value of .true. if any pixels are undefined.
*/
{
    int naxis, ii;
    long naxes[9];
    LONGLONG nelem = 1;

    if (*status > 0)   /* inherit input status value if > 0 */
        return(*status);

    /* get the size of the image */
    ffgidm(fptr, &naxis, status);
    ffgisz(fptr, 9, naxes, status);

    /* test for the important special case where we are reading the whole image */
    /* this is only useful for images that are not tile-compressed */
    if (!fits_is_compressed_image(fptr, status)) {
        for (ii = 0; ii < naxis; ii++) {
            if (inc[ii] != 1 || blc[ii] !=1 || trc[ii] != naxes[ii])
                break;

            nelem = nelem * naxes[ii];
        }

        if (ii == naxis) {
            /* read the whole image more efficiently */
            ffgpxv(fptr, datatype, blc, nelem, nulval, array, anynul, status);
            return(*status);
        }
    }

    if (datatype == TBYTE)
    {
      if (nulval == 0)
        ffgsvb(fptr, 1, naxis, naxes, blc, trc, inc, 0,
               (unsigned char *) array, anynul, status);
      else
        ffgsvb(fptr, 1, naxis, naxes, blc, trc, inc, *(unsigned char *) nulval,
               (unsigned char *) array, anynul, status);
    }
    else if (datatype == TSBYTE)
    {
      if (nulval == 0)
        ffgsvsb(fptr, 1, naxis, naxes, blc, trc, inc, 0,
               (signed char *) array, anynul, status);
      else
        ffgsvsb(fptr, 1, naxis, naxes, blc, trc, inc, *(signed char *) nulval,
               (signed char *) array, anynul, status);
    }
    else if (datatype == TUSHORT)
    {
      if (nulval == 0)
        ffgsvui(fptr, 1, naxis, naxes, blc, trc, inc, 0,
               (unsigned short *) array, anynul, status);
      else
        ffgsvui(fptr, 1, naxis, naxes,blc, trc, inc, *(unsigned short *) nulval,
               (unsigned short *) array, anynul, status);
    }
    else if (datatype == TSHORT)
    {
      if (nulval == 0)
        ffgsvi(fptr, 1, naxis, naxes, blc, trc, inc, 0,
               (short *) array, anynul, status);
      else
        ffgsvi(fptr, 1, naxis, naxes, blc, trc, inc, *(short *) nulval,
               (short *) array, anynul, status);
    }
    else if (datatype == TUINT)
    {
      if (nulval == 0)
        ffgsvuk(fptr, 1, naxis, naxes, blc, trc, inc, 0,
               (unsigned int *) array, anynul, status);
      else
        ffgsvuk(fptr, 1, naxis, naxes, blc, trc, inc, *(unsigned int *) nulval,
               (unsigned int *) array, anynul, status);
    }
    else if (datatype == TINT)
    {
      if (nulval == 0)
        ffgsvk(fptr, 1, naxis, naxes, blc, trc, inc, 0,
               (int *) array, anynul, status);
      else
        ffgsvk(fptr, 1, naxis, naxes, blc, trc, inc, *(int *) nulval,
               (int *) array, anynul, status);
    }
    else if (datatype == TULONG)
    {
      if (nulval == 0)
        ffgsvuj(fptr, 1, naxis, naxes, blc, trc, inc, 0,
               (unsigned long *) array, anynul, status);
      else
        ffgsvuj(fptr, 1, naxis, naxes, blc, trc, inc, *(unsigned long *) nulval,
               (unsigned long *) array, anynul, status);
    }
    else if (datatype == TLONG)
    {
      if (nulval == 0)
        ffgsvj(fptr, 1, naxis, naxes, blc, trc, inc, 0,
               (long *) array, anynul, status);
      else
        ffgsvj(fptr, 1, naxis, naxes, blc, trc, inc, *(long *) nulval,
               (long *) array, anynul, status);
    }
    else if (datatype == TULONGLONG)
    {
      if (nulval == 0)
        ffgsvujj(fptr, 1, naxis, naxes, blc, trc, inc, 0,
               (ULONGLONG *) array, anynul, status);
      else
        ffgsvujj(fptr, 1, naxis, naxes, blc, trc, inc, *(ULONGLONG *) nulval,
               (ULONGLONG *) array, anynul, status);
    }
    else if (datatype == TLONGLONG)
    {
      if (nulval == 0)
        ffgsvjj(fptr, 1, naxis, naxes, blc, trc, inc, 0,
               (LONGLONG *) array, anynul, status);
      else
        ffgsvjj(fptr, 1, naxis, naxes, blc, trc, inc, *(LONGLONG *) nulval,
               (LONGLONG *) array, anynul, status);
    }
    else if (datatype == TFLOAT)
    {
      if (nulval == 0)
        ffgsve(fptr, 1, naxis, naxes, blc, trc, inc, 0,
               (float *) array, anynul, status);
      else
        ffgsve(fptr, 1, naxis, naxes, blc, trc, inc, *(float *) nulval,
               (float *) array, anynul, status);
    }
    else if (datatype == TDOUBLE)
    {
      if (nulval == 0)
        ffgsvd(fptr, 1, naxis, naxes, blc, trc, inc, 0,
               (double *) array, anynul, status);
      else
        ffgsvd(fptr, 1, naxis, naxes, blc, trc, inc, *(double *) nulval,
               (double *) array, anynul, status);
    }
    else
      *status = BAD_DATATYPE;

    return(*status);
}